

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O0

uint __thiscall irr::CIrrDeviceSDL::sleep(CIrrDeviceSDL *this,uint __seconds)

{
  int iVar1;
  uint uVar2;
  byte in_DL;
  bool wasStopped;
  byte local_19;
  
  if ((this->super_CIrrDeviceStub).Timer == (ITimer *)0x0) {
    local_19 = 1;
  }
  else {
    iVar1 = (*((this->super_CIrrDeviceStub).Timer)->_vptr_ITimer[7])();
    local_19 = (byte)iVar1;
  }
  if (((in_DL & 1) != 0) && ((local_19 & 1) == 0)) {
    (*((this->super_CIrrDeviceStub).Timer)->_vptr_ITimer[3])();
  }
  uVar2 = SDL_Delay(__seconds);
  if (((in_DL & 1) != 0) && ((local_19 & 1) == 0)) {
    uVar2 = (*((this->super_CIrrDeviceStub).Timer)->_vptr_ITimer[4])();
  }
  return uVar2;
}

Assistant:

void CIrrDeviceSDL::sleep(u32 timeMs, bool pauseTimer)
{
	const bool wasStopped = Timer ? Timer->isStopped() : true;
	if (pauseTimer && !wasStopped)
		Timer->stop();

	SDL_Delay(timeMs);

	if (pauseTimer && !wasStopped)
		Timer->start();
}